

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GameEngine.cpp
# Opt level: O2

void __thiscall
GameEngine::getPopulationPattern
          (GameEngine *this,vector<LightPopulation,_std::allocator<LightPopulation>_> *populations)

{
  pointer psVar1;
  pointer psVar2;
  vector<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_> *pvVar3;
  shared_ptr<Population> *population;
  pointer psVar4;
  shared_ptr<Player> *player;
  pointer psVar5;
  
  psVar1 = (this->players).
           super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  for (psVar5 = (this->players).
                super__Vector_base<std::shared_ptr<Player>,_std::allocator<std::shared_ptr<Player>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar5 != psVar1; psVar5 = psVar5 + 1) {
    pvVar3 = Player::GetPlayerPopulations
                       ((psVar5->super___shared_ptr<Player,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    psVar2 = (pvVar3->
             super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (pvVar3->
                  super__Vector_base<std::shared_ptr<Population>,_std::allocator<std::shared_ptr<Population>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2; psVar4 = psVar4 + 1)
    {
      std::vector<LightPopulation,std::allocator<LightPopulation>>::emplace_back<Population&>
                ((vector<LightPopulation,std::allocator<LightPopulation>> *)populations,
                 (psVar4->super___shared_ptr<Population,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    }
  }
  return;
}

Assistant:

void GameEngine::getPopulationPattern(std::vector<LightPopulation> &populations) {
  for (const auto &player : players) {
    for (const auto &population : player->GetPlayerPopulations()) {
      populations.emplace_back(*population);
    }
  }
}